

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cb_enumerator.cpp
# Opt level: O0

void __thiscall Clasp::CBConsequences::CBFinder::pushLocked(CBFinder *this,Solver *s,ClauseHead *c)

{
  bool bVar1;
  int iVar2;
  reference ppCVar3;
  Constraint **in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  ClauseHead *h;
  byte local_31;
  pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> *in_stack_ffffffffffffffe0;
  
  while( true ) {
    bVar1 = bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::empty
                      ((pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> *)
                       (in_RDI + 0x60));
    local_31 = 0;
    if (!bVar1) {
      ppCVar3 = bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::back
                          ((pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> *)
                           (in_RDI + 0x60));
      in_stack_ffffffffffffffe0 =
           (pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> *)*ppCVar3;
      iVar2 = (*(code *)(in_stack_ffffffffffffffe0->ebo_).buf[0xb])
                        (in_stack_ffffffffffffffe0,in_RSI);
      local_31 = (byte)iVar2 ^ 0xff;
    }
    if ((local_31 & 1) == 0) break;
    (*(code *)(in_stack_ffffffffffffffe0->ebo_).buf[5])(in_stack_ffffffffffffffe0,in_RSI,1);
    bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::pop_back
              ((pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_> *)
               (in_RDI + 0x60));
  }
  bk_lib::pod_vector<Clasp::Constraint_*,_std::allocator<Clasp::Constraint_*>_>::push_back
            (in_stack_ffffffffffffffe0,in_RDX);
  return;
}

Assistant:

void CBConsequences::CBFinder::pushLocked(Solver& s, ClauseHead* c) {
	for (ClauseHead* h; !locked.empty() && !(h = static_cast<ClauseHead*>(locked.back()))->locked(s);) {
		h->destroy(&s, true);
		locked.pop_back();
	}
	locked.push_back(c);
}